

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(mbedtls_mpi_uint *N)

{
  mbedtls_mpi_uint mVar1;
  long lVar2;
  uint i;
  uint uVar3;
  
  mVar1 = *N;
  lVar2 = ((int)mVar1 * 2 + 4U & 8) + mVar1;
  for (uVar3 = 0x40; 7 < uVar3; uVar3 = uVar3 >> 1) {
    lVar2 = lVar2 * (2 - lVar2 * mVar1);
  }
  return -lVar2;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(const mbedtls_mpi_uint *N)
{
    mbedtls_mpi_uint x = N[0];

    x += ((N[0] + 2) & 4) << 1;

    for (unsigned int i = biL; i >= 8; i /= 2) {
        x *= (2 - (N[0] * x));
    }

    return ~x + 1;
}